

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

XmlWriter * __thiscall Catch::XmlWriter::writeAttribute(XmlWriter *this,string *name,bool attribute)

{
  char *pcVar1;
  ostream *poVar2;
  undefined7 in_register_00000011;
  
  poVar2 = this->m_os;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=\"",2);
  pcVar1 = "called == false";
  if ((int)CONCAT71(in_register_00000011,attribute) != 0) {
    pcVar1 = "called == true";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,pcVar1 + 10,CONCAT71(in_register_00000011,attribute) & 0xffffffff ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, bool attribute ) {
            stream() << " " << name << "=\"" << ( attribute ? "true" : "false" ) << "\"";
            return *this;
        }